

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O2

string * __thiscall
sznet::Timestamp::toString_abi_cxx11_(string *__return_storage_ptr__,Timestamp *this)

{
  char acStack_48 [8];
  char buf [32];
  allocator local_19;
  
  acStack_48[0] = '\0';
  acStack_48[1] = '\0';
  acStack_48[2] = '\0';
  acStack_48[3] = '\0';
  acStack_48[4] = '\0';
  acStack_48[5] = '\0';
  acStack_48[6] = '\0';
  acStack_48[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  snprintf(acStack_48,0x20,"%ldd.%06ldd",this->m_microSecondsSinceEpoch / 1000000,
           this->m_microSecondsSinceEpoch % 1000000);
  std::__cxx11::string::string((string *)__return_storage_ptr__,acStack_48,&local_19);
  return __return_storage_ptr__;
}

Assistant:

string Timestamp::toString() const
{
	char buf[32] = { 0 };
	int64_t seconds = m_microSecondsSinceEpoch / kMicroSecondsPerSecond;
	int64_t microseconds = m_microSecondsSinceEpoch % kMicroSecondsPerSecond;
	snprintf(buf, sizeof(buf), "%" PRId64 "d.%06" PRId64 "d", seconds, microseconds);
	return buf;
}